

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_create_secret.cpp
# Opt level: O1

SourceResultType __thiscall
duckdb::PhysicalCreateSecret::GetData
          (PhysicalCreateSecret *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSourceInput *input)

{
  ClientContext *context_00;
  ClientContext *context_01;
  pointer *__ptr;
  undefined1 local_68 [72];
  
  context_00 = context->client;
  context_01 = (ClientContext *)SecretManager::Get(context_00);
  SecretManager::CreateSecret((SecretManager *)local_68,context_01,(CreateSecretInput *)context_00);
  if ((SecretEntry *)local_68._0_8_ != (SecretEntry *)0x0) {
    ::std::default_delete<duckdb::SecretEntry>::operator()
              ((default_delete<duckdb::SecretEntry> *)local_68,(SecretEntry *)local_68._0_8_);
  }
  local_68._0_8_ = (_func_int **)0x0;
  Value::Value((Value *)(local_68 + 8),1);
  DataChunk::SetValue(chunk,0,0,(Value *)(local_68 + 8));
  Value::~Value((Value *)(local_68 + 8));
  chunk->count = 1;
  return FINISHED;
}

Assistant:

SourceResultType PhysicalCreateSecret::GetData(ExecutionContext &context, DataChunk &chunk,
                                               OperatorSourceInput &input) const {
	auto &client = context.client;
	auto &secret_manager = SecretManager::Get(client);

	secret_manager.CreateSecret(client, create_input);

	chunk.SetValue(0, 0, true);
	chunk.SetCardinality(1);

	return SourceResultType::FINISHED;
}